

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

bool EV_StartWaggle(int tag,line_t_conflict *line,int height,int speed,int offset,int timer,
                   bool ceiling)

{
  bool bVar1;
  uint uVar2;
  DCeilingWaggle *this;
  bool bVar3;
  long lVar4;
  sector_t_conflict *this_00;
  FSectorTagIterator itr;
  FSectorTagIterator local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (tag == 0) {
    local_68.searchtag = -0x80000000;
    local_68.start = -1;
    if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
      local_68.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
    }
  }
  else {
    local_68.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    local_68.searchtag = tag;
  }
  uVar2 = FSectorTagIterator::Next(&local_68);
  bVar3 = false;
  if (-1 < (int)uVar2) {
    local_60 = (double)offset;
    local_48 = (double)speed * 0.015625;
    dStack_50 = (double)height * 0.015625;
    local_58 = dStack_50 / (double)((height * 0x69) / 0xff + 0x23);
    bVar3 = false;
    dStack_40 = dStack_50;
    do {
      while (this_00 = sectors + uVar2, !ceiling) {
        bVar1 = sector_t::PlaneMoving(this_00,0);
        if (bVar1) goto LAB_003f9935;
        this = (DCeilingWaggle *)
               M_Malloc_Dbg(0x80,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        lVar4 = 200;
        DFloorWaggle::DFloorWaggle((DFloorWaggle *)this,this_00);
LAB_003f996b:
        (this->super_DWaggleBase).m_OriginalDist =
             *(double *)((long)&this_00->planes[0].xform.xOffs + lVar4);
        (this->super_DWaggleBase).m_Accumulator = local_60;
        (this->super_DWaggleBase).m_Scale = 0.0;
        (this->super_DWaggleBase).m_AccDelta = local_48;
        (this->super_DWaggleBase).m_TargetScale = dStack_40;
        (this->super_DWaggleBase).m_ScaleDelta = local_58;
        (this->super_DWaggleBase).m_Ticker = -(uint)(timer == 0) | timer * 0x23;
        (this->super_DWaggleBase).m_State = 1;
        uVar2 = FSectorTagIterator::Next(&local_68);
        bVar3 = true;
        if ((int)uVar2 < 0) {
          return true;
        }
      }
      bVar1 = sector_t::PlaneMoving(this_00,1);
      if (!bVar1) {
        this = (DCeilingWaggle *)
               M_Malloc_Dbg(0x80,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        lVar4 = 0xf0;
        DCeilingWaggle::DCeilingWaggle(this,this_00);
        goto LAB_003f996b;
      }
LAB_003f9935:
      uVar2 = FSectorTagIterator::Next(&local_68);
    } while (-1 < (int)uVar2);
  }
  return bVar3;
}

Assistant:

bool EV_StartWaggle (int tag, line_t *line, int height, int speed, int offset,
	int timer, bool ceiling)
{
	int sectorIndex;
	sector_t *sector;
	DWaggleBase *waggle;
	bool retCode;

	retCode = false;

	FSectorTagIterator itr(tag, line);

	while ((sectorIndex = itr.Next()) >= 0)
	{
		sector = &sectors[sectorIndex];
		if ((!ceiling && sector->PlaneMoving(sector_t::floor)) || 
			(ceiling && sector->PlaneMoving(sector_t::ceiling)))
		{ // Already busy with another thinker
			continue;
		}
		retCode = true;
		if (ceiling)
		{
			waggle = new DCeilingWaggle (sector);
			waggle->m_OriginalDist = sector->ceilingplane.fD();
		}
		else
		{
			waggle = new DFloorWaggle (sector);
			waggle->m_OriginalDist = sector->floorplane.fD();
		}
		waggle->m_Accumulator = offset;
		waggle->m_AccDelta = speed / 64.;
		waggle->m_Scale = 0;
		waggle->m_TargetScale = height / 64.;
		waggle->m_ScaleDelta = waggle->m_TargetScale / (TICRATE + ((3 * TICRATE)*height) / 255);
		waggle->m_Ticker = timer ? timer*TICRATE : -1;
		waggle->m_State = WGLSTATE_EXPAND;
	}
	return retCode;
}